

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_nego(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 pTVar2;
  TCGv_i64 arg2;
  TCGContext_conflict10 *s;
  TCGv_i64 arg1;
  TCGTemp *a2;
  uintptr_t o;
  uintptr_t o_1;
  TCGv_i64 ret;
  uintptr_t o_2;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  arg1 = tcg_const_i64_ppc64(tcg_ctx,0);
  uVar1 = ctx->opcode;
  pTVar2 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8));
  arg2 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8));
  s = ctx->uc->tcg_ctx;
  a2 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a2 - (long)s);
  tcg_gen_sub_i64(s,ret,arg1,arg2);
  gen_op_arith_compute_ov(ctx,ret,arg2,arg1,1);
  if ((uVar1 & 1) != 0) {
    uVar1._0_1_ = ctx->sf_mode;
    uVar1._1_1_ = ctx->has_cfar;
    uVar1._2_1_ = ctx->fpu_enabled;
    uVar1._3_1_ = ctx->altivec_enabled;
    gen_set_Rc0((DisasContext_conflict10 *)(ulong)uVar1,(TCGv_i64)ctx->uc->tcg_ctx);
  }
  if (pTVar2 != ret) {
    tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,(TCGArg)(pTVar2 + (long)s),(TCGArg)a2);
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret + (long)s));
  }
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(arg1 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_nego(DisasContext *ctx)
{
    gen_op_arith_neg(ctx, 1);
}